

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StripEH.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_150::StripEHImpl::~StripEHImpl(StripEHImpl *this)

{
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::StripEHImpl,_wasm::Visitor<wasm::(anonymous_namespace)::StripEHImpl,_void>_>_>
  ::~WalkerPass(&this->
                 super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::StripEHImpl,_wasm::Visitor<wasm::(anonymous_namespace)::StripEHImpl,_void>_>_>
               );
  operator_delete(this,0x138);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }